

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlGenerator.cpp
# Opt level: O0

void print(ostream *output,ScTransitionMap *transitions)

{
  bool bVar1;
  reference __in;
  type *ptVar2;
  type *this;
  ostream *poVar3;
  char *pcVar4;
  reference pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *event;
  iterator __end3;
  iterator __begin3;
  type *__range3;
  type *events;
  type *target;
  _Self local_30;
  const_iterator __end2;
  const_iterator __begin2;
  ScTransitionMap *__range2;
  ScTransitionMap *transitions_local;
  ostream *output_local;
  
  bVar1 = std::
          map<ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ScTarget>,_std::allocator<std::pair<const_ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::empty(transitions);
  if (!bVar1) {
    std::operator<<(output,"  transitions:\n");
    __end2 = std::
             map<ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ScTarget>,_std::allocator<std::pair<const_ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::begin(transitions);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ScTarget>,_std::allocator<std::pair<const_ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::end(transitions);
    while (bVar1 = std::operator!=(&__end2,&local_30), bVar1) {
      __in = std::
             _Rb_tree_const_iterator<std::pair<const_ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator*(&__end2);
      ptVar2 = std::
               get<0ul,ScTarget_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                         (__in);
      this = std::
             get<1ul,ScTarget_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                       (__in);
      poVar3 = std::operator<<(output,"    - target: ");
      poVar3 = std::operator<<(poVar3,(string *)ptVar2);
      std::operator<<(poVar3,"\n");
      if (ptVar2->historyMode != None) {
        poVar3 = std::operator<<(output,"      history: ");
        pcVar4 = toString(ptVar2->historyMode);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::operator<<(poVar3,"\n");
      }
      std::operator<<(output,"      events:\n");
      __end3 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this);
      event = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(this);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&event), bVar1) {
        pbVar5 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end3);
        poVar3 = std::operator<<(output,"        - ");
        poVar3 = std::operator<<(poVar3,(string *)pbVar5);
        std::operator<<(poVar3,"\n");
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

static void print(std::ostream &output, const ScTransitionMap &transitions) noexcept
{
    if (!transitions.empty()) {
        output << "  transitions:\n";
        for (const auto &[target, events] : transitions) {
            output << "    - target: " << target.name << "\n";
            if (target.historyMode != ScHistoryMode::None) {
                output << "      history: " << toString(target.historyMode) << "\n";
            }
            output << "      events:\n";
            for (const auto &event : events) {
                output << "        - " << event << "\n";
            }
        }
    }
}